

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined2 *puVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  BIT_DStream_t bitD;
  
  sVar4 = BIT_initDStream(&bitD,cSrc,cSrcSize);
  if (sVar4 < 0xffffffffffffff89) {
    puVar1 = (undefined2 *)((long)dst + dstSize);
    uVar6 = *DTable;
    iVar9 = (int)bitD.start;
    if (dstSize < 8) {
      uVar11 = (ulong)bitD.bitsConsumed;
      if (uVar11 < 0x41) {
        if (bitD.ptr < bitD.limitPtr) {
          if (bitD.ptr != bitD.start) {
            uVar11 = (ulong)(uint)((int)bitD.ptr - iVar9);
            if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
              uVar11 = (ulong)(bitD.bitsConsumed >> 3);
            }
            bitD.ptr = bitD.ptr + -uVar11;
            bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar11 * -8;
            uVar11 = (ulong)bitD.bitsConsumed;
            bitD.bitContainer = *(size_t *)bitD.ptr;
          }
        }
        else {
          bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
          bitD.bitsConsumed = bitD.bitsConsumed & 7;
          uVar11 = (ulong)bitD.bitsConsumed;
          bitD.bitContainer = *(size_t *)bitD.ptr;
        }
      }
    }
    else {
      uVar8 = -(uVar6 >> 0x10) & 0x3f;
      uVar11 = (ulong)bitD.bitsConsumed;
      if ((uVar6 & 0xfc0000) < 0xc0000) {
        while (uVar5 = (uint)uVar11, uVar5 < 0x41) {
          if (bitD.ptr < bitD.limitPtr) {
            if (bitD.ptr == bitD.start) break;
            bVar13 = bitD.start <= (char *)((long)bitD.ptr - (uVar11 >> 3));
            uVar10 = (int)bitD.ptr - iVar9;
            if (bVar13) {
              uVar10 = (uint)(uVar11 >> 3);
            }
            uVar5 = uVar5 + uVar10 * -8;
          }
          else {
            uVar10 = (uint)(uVar11 >> 3);
            uVar5 = uVar5 & 7;
            bVar13 = true;
          }
          uVar11 = (ulong)uVar5;
          bitD.ptr = (char *)((long)bitD.ptr - (ulong)uVar10);
          bitD.bitContainer = *(size_t *)bitD.ptr;
          if (((undefined2 *)((long)puVar1 - 9U) <= dst) || (!bVar13)) break;
          uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar8;
          *(short *)dst = (short)DTable[uVar11 + 1];
          uVar5 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar5;
          uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
          uVar7 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar11) = (short)DTable[uVar7 + 1];
          uVar5 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar5;
          uVar7 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
          lVar2 = uVar7 + uVar11;
          uVar12 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar7 + uVar11) = (short)DTable[uVar12 + 1];
          uVar5 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar5;
          uVar11 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
          lVar3 = uVar11 + lVar2;
          uVar7 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar11 + lVar2) = (short)DTable[uVar7 + 1];
          uVar5 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar5;
          uVar11 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
          uVar7 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar11 + lVar3) = (short)DTable[uVar7 + 1];
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7) + uVar11 + lVar3
                        );
          uVar11 = (ulong)(*(byte *)((long)DTable + uVar7 * 4 + 6) + uVar5);
        }
      }
      else {
        while (uVar5 = (uint)uVar11, uVar5 < 0x41) {
          if (bitD.ptr < bitD.limitPtr) {
            if (bitD.ptr == bitD.start) break;
            bVar13 = bitD.start <= (char *)((long)bitD.ptr - (uVar11 >> 3));
            uVar7 = (ulong)(uint)((int)bitD.ptr - iVar9);
            if (bVar13) {
              uVar7 = uVar11 >> 3;
            }
            uVar5 = uVar5 + (int)uVar7 * -8;
          }
          else {
            uVar7 = uVar11 >> 3;
            uVar5 = uVar5 & 7;
            bVar13 = true;
          }
          uVar11 = (ulong)uVar5;
          bitD.ptr = (char *)((long)bitD.ptr - uVar7);
          bitD.bitContainer = *(size_t *)bitD.ptr;
          if (((undefined2 *)((long)puVar1 - 7U) <= dst) || (!bVar13)) break;
          uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar8;
          *(short *)dst = (short)DTable[uVar11 + 1];
          uVar5 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar5;
          uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
          uVar7 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar11) = (short)DTable[uVar7 + 1];
          uVar5 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar5;
          uVar12 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
          lVar2 = uVar12 + uVar11;
          uVar7 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar12 + uVar11) = (short)DTable[uVar7 + 1];
          uVar5 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar5;
          uVar11 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
          uVar7 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar8;
          *(short *)((long)dst + uVar11 + lVar2) = (short)DTable[uVar7 + 1];
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7) + uVar11 + lVar2
                        );
          uVar11 = (ulong)(*(byte *)((long)DTable + uVar7 * 4 + 6) + uVar5);
        }
      }
      bitD.bitsConsumed = (uint)uVar11;
    }
    if (1 < (ulong)((long)puVar1 - (long)dst)) {
      uVar8 = -(uVar6 >> 0x10) & 0x3f;
      while (uVar5 = (uint)uVar11, uVar5 < 0x41) {
        if (bitD.ptr < bitD.limitPtr) {
          if (bitD.ptr == bitD.start) break;
          bVar13 = bitD.start <= bitD.ptr + -(uVar11 >> 3);
          uVar7 = (ulong)(uint)((int)bitD.ptr - iVar9);
          if (bVar13) {
            uVar7 = uVar11 >> 3;
          }
          bitD.bitsConsumed = uVar5 + (int)uVar7 * -8;
        }
        else {
          uVar7 = uVar11 >> 3;
          bitD.bitsConsumed = uVar5 & 7;
          bVar13 = true;
        }
        bitD.ptr = bitD.ptr + -uVar7;
        uVar11 = (ulong)bitD.bitsConsumed;
        bitD.bitContainer = *(size_t *)bitD.ptr;
        if ((puVar1 + -1 < dst) || (!bVar13)) break;
        uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar8;
        *(short *)dst = (short)DTable[uVar11 + 1];
        bitD.bitsConsumed = *(byte *)((long)DTable + uVar11 * 4 + 6) + bitD.bitsConsumed;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7));
        uVar11 = (ulong)bitD.bitsConsumed;
      }
      for (; dst <= puVar1 + -1;
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7))) {
        uVar7 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar8;
        *(short *)dst = (short)DTable[uVar7 + 1];
        bitD.bitsConsumed = *(byte *)((long)DTable + uVar7 * 4 + 6) + bitD.bitsConsumed;
        uVar11 = (ulong)bitD.bitsConsumed;
      }
    }
    uVar8 = (uint)uVar11;
    if (dst < puVar1) {
      uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >>
               ((ulong)(byte)-(char)(uVar6 >> 0x10) & 0x3f);
      *(char *)dst = (char)DTable[uVar11 + 1];
      if (*(char *)((long)DTable + uVar11 * 4 + 7) == '\x01') {
        uVar8 = *(byte *)((long)DTable + uVar11 * 4 + 6) + bitD.bitsConsumed;
      }
      else {
        uVar8 = bitD.bitsConsumed;
        if (bitD.bitsConsumed < 0x40) {
          uVar6 = bitD.bitsConsumed + *(byte *)((long)DTable + uVar11 * 4 + 6);
          uVar8 = 0x40;
          if (uVar6 < 0x40) {
            uVar8 = uVar6;
          }
        }
      }
    }
    if (uVar8 != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    sVar4 = dstSize;
    if (bitD.ptr != bitD.start) {
      sVar4 = 0xffffffffffffffec;
    }
  }
  return sVar4;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}